

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::TimedText::MXFWriter::h__Writer::WriteTimedTextResource
          (h__Writer *this,string *XMLDoc,AESEncContext *Ctx,HMACContext *HMAC)

{
  int iVar1;
  ui32_t size;
  byte_t *__dest;
  void *__src;
  undefined1 local_120 [112];
  IndexEntry Entry;
  FrameBuffer FrameBuf;
  ui32_t str_size;
  HMACContext *HMAC_local;
  AESEncContext *Ctx_local;
  string *XMLDoc_local;
  h__Writer *this_local;
  Result_t *result;
  
  MXF::h__WriterState::Goto_RUNNING((h__WriterState *)this);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    size = std::__cxx11::string::size();
    FrameBuffer::FrameBuffer((FrameBuffer *)&Entry.StreamOffset,size);
    __dest = ASDCP::FrameBuffer::Data((FrameBuffer *)&Entry.StreamOffset);
    __src = (void *)std::__cxx11::string::c_str();
    memcpy(__dest,__src,(ulong)size);
    ASDCP::FrameBuffer::Size((FrameBuffer *)&Entry.StreamOffset,size);
    MXF::IndexTableSegment::IndexEntry::IndexEntry((IndexEntry *)(local_120 + 0x68));
    Entry.TemporalOffset = *(i8_t *)&XMLDoc[0x1a]._M_dataplus;
    Entry.KeyFrameOffset = XMLDoc[0x1a].field_0x1;
    Entry.Flags = XMLDoc[0x1a].field_0x2;
    Entry._11_5_ = *(undefined5 *)&XMLDoc[0x1a].field_0x3;
    h__ASDCPWriter::WriteEKLVPacket
              ((h__ASDCPWriter *)local_120,(FrameBuffer *)XMLDoc,(byte_t *)&Entry.StreamOffset,
               (ui32_t *)&XMLDoc[0x3c]._M_string_length,(AESEncContext *)&MXF_BER_LENGTH,HMAC);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_120);
    Kumu::Result_t::~Result_t((Result_t *)local_120);
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar1) {
      MXF::OPAtomIndexFooter::PushIndexEntry
                ((OPAtomIndexFooter *)&XMLDoc[0x2b]._M_string_length,
                 (IndexEntry *)(local_120 + 0x68));
      *(int *)((long)&XMLDoc[0x19].field_2 + 8) = *(int *)((long)&XMLDoc[0x19].field_2 + 8) + 1;
    }
    MXF::IndexTableSegment::IndexEntry::~IndexEntry((IndexEntry *)(local_120 + 0x68));
    FrameBuffer::~FrameBuffer((FrameBuffer *)&Entry.StreamOffset);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFWriter::h__Writer::WriteTimedTextResource(const std::string& XMLDoc,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  Result_t result = m_State.Goto_RUNNING();

  if ( ASDCP_SUCCESS(result) )
    {
      // TODO: make sure it's XML

      ui32_t str_size = XMLDoc.size();
      FrameBuffer FrameBuf(str_size);
      
      memcpy(FrameBuf.Data(), XMLDoc.c_str(), str_size);
      FrameBuf.Size(str_size);

      IndexTableSegment::IndexEntry Entry;
      Entry.StreamOffset = m_StreamOffset;
      result = WriteEKLVPacket(FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  m_FooterPart.PushIndexEntry(Entry);
	  m_FramesWritten++;
	}
    }

  return result;
}